

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void do_cmd_stash(command *cmd)

{
  _Bool _Var1;
  char cVar2;
  wchar_t wVar3;
  store *store;
  object *obj_00;
  char *fmt;
  _Bool none_left;
  object *obj;
  wchar_t amt;
  char o_name [120];
  object dummy;
  _Bool local_1f9;
  object *local_1f8;
  wchar_t local_1ec;
  char local_1e8 [128];
  object local_168;
  
  store = store_at((chunk_conflict2 *)cave,player->grid);
  local_1f9 = false;
  wVar3 = cmd_get_arg_item((command_conflict *)cmd,"item",&local_1f8);
  if (wVar3 != L'\0') {
    return;
  }
  wVar3 = cmd_get_quantity((command_conflict *)cmd,"quantity",&local_1ec,(uint)local_1f8->number);
  if (wVar3 == L'\0') {
    if (store->sidx == store_home_idx) {
      _Var1 = object_is_equipped(player->body,local_1f8);
      if ((!_Var1) || (_Var1 = obj_can_takeoff(local_1f8), _Var1)) {
        object_copy_amt(&local_168,local_1f8,local_1ec);
        _Var1 = store_check_num(store,&local_168);
        object_wipe(&local_168);
        if (_Var1) {
          cVar2 = gear_to_label(player,local_1f8);
          obj_00 = gear_object_for_use(player,local_1f8,local_1ec,false,&local_1f9);
          object_desc(local_1e8,0x78,obj_00,0x43,player);
          msg("You drop %s (%c).",local_1e8,(ulong)(uint)(int)cVar2);
          handle_stuff(player);
          home_carry(obj_00);
          event_signal(EVENT_STORECHANGED);
          event_signal(EVENT_INVENTORY);
          event_signal(EVENT_EQUIPMENT);
          return;
        }
        fmt = "Your home is full.";
      }
      else {
        fmt = "Hmmm, it seems to be stuck.";
      }
    }
    else {
      fmt = "You are not in your home.";
    }
    msg(fmt);
    return;
  }
  return;
}

Assistant:

void do_cmd_stash(struct command *cmd)
{
	int amt;
	struct object dummy;
	struct store *store = store_at(cave, player->grid);
	char o_name[120];
	char label;

	struct object *obj, *dropped;
	bool none_left = false;
	bool no_room;

	if (cmd_get_arg_item(cmd, "item", &obj))
		return;

	if (cmd_get_quantity(cmd, "quantity", &amt, obj->number) != CMD_OK)
		return;

	/* Check we are somewhere we can stash items. */
	if (!store_is_home(store)) {
		msg("You are not in your home.");
		return;
	}

	/* Cannot remove stickied objects */
	if (object_is_equipped(player->body, obj) && !obj_can_takeoff(obj)) {
		msg("Hmmm, it seems to be stuck.");
		return;
	}	

	/* Get a copy of the object representing the number being sold */
	object_copy_amt(&dummy, obj, amt);

	no_room = !store_check_num(store, &dummy);
	/*
	 * Do not need the dummy any more so release the memory allocated
	 * within it.
	 */
	object_wipe(&dummy);
	if (no_room) {
		msg("Your home is full.");
		return;
	}

	/* Get where the object is now */
	label = gear_to_label(player, obj);

	/* Now get the real item */
	dropped = gear_object_for_use(player, obj, amt, false, &none_left);

	/* Describe */
	object_desc(o_name, sizeof(o_name), dropped,
		ODESC_PREFIX | ODESC_FULL, player);

	/* Message */
	msg("You drop %s (%c).", o_name, label);

	/* Handle stuff */
	handle_stuff(player);

	/* Let the home carry it */
	home_carry(dropped);

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}